

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O2

void ImStb::stb_textedit_discard_undo(StbUndoState *state)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  ushort uVar4;
  long lVar5;
  
  uVar1 = state->undo_point;
  if (0 < (short)uVar1) {
    if (-1 < state->undo_rec[0].char_storage) {
      iVar2 = state->undo_rec[0].insert_length;
      lVar5 = (long)state->undo_char_point - (long)iVar2;
      state->undo_char_point = (int)lVar5;
      memmove(state->undo_char,state->undo_char + iVar2,lVar5 * 2);
      uVar1 = state->undo_point;
      lVar5 = 0;
      uVar4 = uVar1;
      if ((short)uVar1 < 1) {
        uVar4 = 0;
      }
      for (; (ulong)uVar4 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
        iVar3 = *(int *)((long)&state->undo_rec[0].char_storage + lVar5);
        if (-1 < iVar3) {
          *(int *)((long)&state->undo_rec[0].char_storage + lVar5) = iVar3 - iVar2;
        }
      }
    }
    state->undo_point = uVar1 - 1;
    memmove(state,state->undo_rec + 1,(long)(short)(uVar1 - 1) << 4);
    return;
  }
  return;
}

Assistant:

static void stb_textedit_discard_undo(StbUndoState *state)
{
   if (state->undo_point > 0) {
      // if the 0th undo state has characters, clean those up
      if (state->undo_rec[0].char_storage >= 0) {
         int n = state->undo_rec[0].insert_length, i;
         // delete n characters from all other records
         state->undo_char_point -= n;
         STB_TEXTEDIT_memmove(state->undo_char, state->undo_char + n, (size_t) (state->undo_char_point*sizeof(STB_TEXTEDIT_CHARTYPE)));
         for (i=0; i < state->undo_point; ++i)
            if (state->undo_rec[i].char_storage >= 0)
               state->undo_rec[i].char_storage -= n; // @OPTIMIZE: get rid of char_storage and infer it
      }
      --state->undo_point;
      STB_TEXTEDIT_memmove(state->undo_rec, state->undo_rec+1, (size_t) (state->undo_point*sizeof(state->undo_rec[0])));
   }
}